

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinja2CppLight.h
# Opt level: O0

string * __thiscall
Jinja2CppLight::TupleValue::render_abi_cxx11_(string *__return_storage_ptr__,TupleValue *this)

{
  bool bVar1;
  bool bVar2;
  element_type *peVar3;
  bool local_72;
  allocator<char> local_71;
  string local_70 [32];
  __shared_ptr *local_50;
  shared_ptr<Jinja2CppLight::Value> *val;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<Jinja2CppLight::Value>,_std::allocator<std::shared_ptr<Jinja2CppLight::Value>_>_>
  *__range2;
  bool isFirst;
  allocator<char> local_1a;
  undefined1 local_19;
  TupleValue *local_18;
  TupleValue *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (TupleValue *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"{",&local_1a)
  ;
  std::allocator<char>::~allocator(&local_1a);
  bVar1 = true;
  __end2 = std::
           vector<std::shared_ptr<Jinja2CppLight::Value>,_std::allocator<std::shared_ptr<Jinja2CppLight::Value>_>_>
           ::begin(&this->values);
  val = (shared_ptr<Jinja2CppLight::Value> *)
        std::
        vector<std::shared_ptr<Jinja2CppLight::Value>,_std::allocator<std::shared_ptr<Jinja2CppLight::Value>_>_>
        ::end(&this->values);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<Jinja2CppLight::Value>_*,_std::vector<std::shared_ptr<Jinja2CppLight::Value>,_std::allocator<std::shared_ptr<Jinja2CppLight::Value>_>_>_>
                                     *)&val), bVar2) {
    local_50 = (__shared_ptr *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<Jinja2CppLight::Value>_*,_std::vector<std::shared_ptr<Jinja2CppLight::Value>,_std::allocator<std::shared_ptr<Jinja2CppLight::Value>_>_>_>
               ::operator*(&__end2);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    local_72 = std::__shared_ptr::operator_cast_to_bool(local_50);
    if (local_72) {
      peVar3 = std::
               __shared_ptr_access<Jinja2CppLight::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Jinja2CppLight::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_50);
      (*peVar3->_vptr_Value[2])(local_70);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_70,"<empty>",&local_71);
    }
    local_72 = !local_72;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_70);
    std::__cxx11::string::~string(local_70);
    if (local_72) {
      std::allocator<char>::~allocator(&local_71);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Jinja2CppLight::Value>_*,_std::vector<std::shared_ptr<Jinja2CppLight::Value>,_std::allocator<std::shared_ptr<Jinja2CppLight::Value>_>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string render() {
        std::string result = "{";
        bool isFirst = true;

        for (auto& val : values) {
            if (isFirst)
                isFirst = false;
            else
                result += ", ";

            result += val ? val->render() : "<empty>";
        }

        result += "}";
        return result;
    }